

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_merge_replace(lyd_node *diff_match,lyd_diff_op cur_op,lyd_node *src_diff)

{
  uint16_t uVar1;
  LY_ERR LVar2;
  lys_module *module;
  size_t value_len;
  lyd_meta *plVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ly_ctx *local_128;
  ly_ctx *local_120;
  ly_ctx *local_108;
  ly_ctx *local_f0;
  ly_ctx *local_d8;
  ly_ctx *local_d0;
  char *__path_6;
  LY_ERR ret___6;
  LY_ERR ret___5;
  char *__path_5;
  LY_ERR ret___4;
  char *__path_4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  char *__path_3;
  LY_ERR ret___1;
  char *__path_2;
  char *__path_1;
  LY_ERR ret__;
  char *__path;
  ly_ctx *ctx;
  lyd_node_any *any;
  lys_module *mod;
  lyd_meta *meta;
  char *orig_meta_name;
  char *meta_name;
  char *str_val;
  LY_ERR ret;
  lyd_node *src_diff_local;
  lyd_diff_op cur_op_local;
  lyd_node *diff_match_local;
  
  if (diff_match->schema == (lysc_node *)0x0) {
    local_d0 = (ly_ctx *)diff_match[2].schema;
  }
  else {
    local_d0 = diff_match->schema->module->ctx;
  }
  if (diff_match->schema == (lysc_node *)0x0) {
    local_d8 = (ly_ctx *)diff_match[2].schema;
  }
  else {
    local_d8 = diff_match->schema->module->ctx;
  }
  module = ly_ctx_get_module_latest(local_d8,"yang");
  if (module == (lys_module *)0x0) {
    __assert_fail("mod",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x5d5,
                  "LY_ERR lyd_diff_merge_replace(struct lyd_node *, enum lyd_diff_op, const struct lyd_node *)"
                 );
  }
  if ((cur_op == LYD_DIFF_OP_CREATE) || (cur_op == LYD_DIFF_OP_REPLACE)) {
    uVar1 = diff_match->schema->nodetype;
    if (uVar1 == 4) {
      LVar2 = lyd_compare_single(diff_match,src_diff,0);
      if (LVar2 == LY_SUCCESS) {
        pcVar4 = lyd_path(diff_match,LYD_PATH_STD,(char *)0x0,0);
        ly_log(local_d0,LY_LLERR,LY_EINVAL,"Unexpected value of node \"%s\" in %s.",pcVar4,
               "target diff");
        free(pcVar4);
        return LY_EINVAL;
      }
      pcVar4 = lyd_get_value(src_diff);
      LVar2 = lyd_change_term(diff_match,pcVar4);
      if (LVar2 == LY_SUCCESS) {
        if (cur_op == LYD_DIFF_OP_REPLACE) {
          plVar3 = lyd_find_meta(diff_match->meta,module,"orig-value");
          if (plVar3 == (lyd_meta *)0x0) {
            pcVar4 = lyd_path(diff_match,LYD_PATH_STD,(char *)0x0,0);
            ly_log(local_d0,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",
                   "orig-value",pcVar4);
            free(pcVar4);
            return LY_EINVAL;
          }
          pcVar4 = lyd_get_meta_value(plVar3);
          value_len = strlen(pcVar4);
          LVar2 = lyd_value_compare((lyd_node_term *)diff_match,pcVar4,value_len);
          if (LVar2 == LY_SUCCESS) {
            lyd_free_meta_single(plVar3);
            LVar2 = lyd_diff_change_op(diff_match,LYD_DIFF_OP_NONE);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
          }
        }
        diff_match->flags = diff_match->flags & 0xfffffffe;
        diff_match->flags = src_diff->flags & 1 | diff_match->flags;
        return LY_SUCCESS;
      }
      if (src_diff->schema == (lysc_node *)0x0) {
        local_f0 = (ly_ctx *)src_diff[2].schema;
      }
      else {
        local_f0 = src_diff->schema->module->ctx;
      }
      ly_log(local_f0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x5f6);
      return LY_EINT;
    }
    if ((uVar1 == 8) || (uVar1 == 0x10)) {
      if ((diff_match->schema == (lysc_node *)0x0) ||
         (((diff_match->schema->nodetype & 0x18) == 0 || ((diff_match->schema->flags & 0x40) == 0)))
         ) {
        __assert_fail("lysc_is_userordered(diff_match->schema)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                      ,0x5df,
                      "LY_ERR lyd_diff_merge_replace(struct lyd_node *, enum lyd_diff_op, const struct lyd_node *)"
                     );
      }
      if ((diff_match->schema == (lysc_node *)0x0) ||
         (((diff_match->schema->nodetype != 0x10 || ((diff_match->schema->flags & 0x200) == 0)) &&
          ((diff_match->schema->nodetype != 8 || ((diff_match->schema->flags & 1) != 0)))))) {
        if (diff_match->schema->nodetype == 0x10) {
          orig_meta_name = "key";
        }
        else {
          orig_meta_name = "value";
        }
      }
      else {
        orig_meta_name = "position";
      }
      lyd_diff_del_meta(diff_match,orig_meta_name);
      plVar3 = lyd_find_meta(src_diff->meta,module,orig_meta_name);
      if (plVar3 == (lyd_meta *)0x0) {
        pcVar4 = lyd_path(src_diff,LYD_PATH_STD,(char *)0x0,0);
        ly_log(local_d0,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",
               orig_meta_name,pcVar4);
        free(pcVar4);
        return LY_EINVAL;
      }
      LVar2 = lyd_dup_meta_single(plVar3,diff_match,(lyd_meta **)0x0);
    }
    else {
      if ((uVar1 != 0x20) && (uVar1 != 0x60)) {
        if (src_diff->schema == (lysc_node *)0x0) {
          local_108 = (ly_ctx *)src_diff[2].schema;
        }
        else {
          local_108 = src_diff->schema->module->ctx;
        }
        ly_log(local_108,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x616
              );
        return LY_EINT;
      }
      LVar2 = lyd_compare_single(diff_match,src_diff,0);
      if (LVar2 == LY_SUCCESS) {
        pcVar4 = lyd_path(diff_match,LYD_PATH_STD,(char *)0x0,0);
        ly_log(local_d0,LY_LLERR,LY_EINVAL,"Unexpected value of node \"%s\" in %s.",pcVar4,
               "target diff");
        free(pcVar4);
        return LY_EINVAL;
      }
      LVar2 = lyd_any_copy_value(diff_match,(lyd_any_value *)(src_diff + 1),
                                 *(LYD_ANYDATA_VALUETYPE *)&src_diff[1].schema);
    }
  }
  else {
    if (cur_op != LYD_DIFF_OP_NONE) {
      pcVar4 = lyd_path(diff_match,LYD_PATH_STD,(char *)0x0,0);
      pcVar5 = lyd_diff_op2str(LYD_DIFF_OP_REPLACE);
      pcVar6 = lyd_diff_op2str(cur_op);
      ly_log(local_d0,LY_LLERR,LY_EINVAL,
             "Unable to merge operation \"%s\" with \"%s\" for node \"%s\".",pcVar5,pcVar6,pcVar4);
      free(pcVar4);
      return LY_EINVAL;
    }
    uVar1 = diff_match->schema->nodetype;
    if (uVar1 == 4) {
      LVar2 = lyd_diff_change_op(diff_match,LYD_DIFF_OP_REPLACE);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      pcVar4 = lyd_get_value(src_diff);
      LVar2 = lyd_change_term(diff_match,pcVar4);
      if (LVar2 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      if (src_diff->schema == (lysc_node *)0x0) {
        local_120 = (ly_ctx *)src_diff[2].schema;
      }
      else {
        local_120 = src_diff->schema->module->ctx;
      }
      ly_log(local_120,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x639);
      return LY_EINT;
    }
    if (uVar1 != 0x10) {
      if (src_diff->schema == (lysc_node *)0x0) {
        local_128 = (ly_ctx *)src_diff[2].schema;
      }
      else {
        local_128 = src_diff->schema->module->ctx;
      }
      ly_log(local_128,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x63d);
      return LY_EINT;
    }
    if (((diff_match->schema == (lysc_node *)0x0) || ((diff_match->schema->nodetype & 0x18) == 0))
       || ((diff_match->schema->flags & 0x40) == 0)) {
      __assert_fail("lysc_is_userordered(diff_match->schema)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x61d,
                    "LY_ERR lyd_diff_merge_replace(struct lyd_node *, enum lyd_diff_op, const struct lyd_node *)"
                   );
    }
    LVar2 = lyd_diff_change_op(diff_match,LYD_DIFF_OP_REPLACE);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    if ((diff_match->schema == (lysc_node *)0x0) ||
       (((diff_match->schema->nodetype != 0x10 || ((diff_match->schema->flags & 0x200) == 0)) &&
        ((diff_match->schema->nodetype != 8 || ((diff_match->schema->flags & 1) != 0)))))) {
      orig_meta_name = "key";
      pcVar4 = "yang:orig-key";
    }
    else {
      orig_meta_name = "position";
      pcVar4 = "yang:orig-position";
    }
    meta = (lyd_meta *)(pcVar4 + 5);
    plVar3 = lyd_find_meta(src_diff->meta,module,(char *)meta);
    if (plVar3 == (lyd_meta *)0x0) {
      pcVar4 = lyd_path(src_diff,LYD_PATH_STD,(char *)0x0,0);
      ly_log(local_d0,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",meta,
             pcVar4);
      free(pcVar4);
      return LY_EINVAL;
    }
    LVar2 = lyd_dup_meta_single(plVar3,diff_match,(lyd_meta **)0x0);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    plVar3 = lyd_find_meta(src_diff->meta,module,orig_meta_name);
    if (plVar3 == (lyd_meta *)0x0) {
      pcVar4 = lyd_path(src_diff,LYD_PATH_STD,(char *)0x0,0);
      ly_log(local_d0,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",
             orig_meta_name,pcVar4);
      free(pcVar4);
      return LY_EINVAL;
    }
    LVar2 = lyd_dup_meta_single(plVar3,diff_match,(lyd_meta **)0x0);
  }
  if (LVar2 == LY_SUCCESS) {
    return LY_SUCCESS;
  }
  return LVar2;
}

Assistant:

static LY_ERR
lyd_diff_merge_replace(struct lyd_node *diff_match, enum lyd_diff_op cur_op, const struct lyd_node *src_diff)
{
    LY_ERR ret;
    const char *str_val, *meta_name, *orig_meta_name;
    struct lyd_meta *meta;
    const struct lys_module *mod;
    const struct lyd_node_any *any;
    const struct ly_ctx *ctx = LYD_CTX(diff_match);

    /* get "yang" module for the metadata */
    mod = ly_ctx_get_module_latest(LYD_CTX(diff_match), "yang");
    assert(mod);

    switch (cur_op) {
    case LYD_DIFF_OP_REPLACE:
    case LYD_DIFF_OP_CREATE:
        switch (diff_match->schema->nodetype) {
        case LYS_LIST:
        case LYS_LEAFLIST:
            /* it was created/moved somewhere, but now it will be created/moved somewhere else,
             * keep orig_key/orig_value (only replace oper) and replace key/value */
            assert(lysc_is_userordered(diff_match->schema));
            if (lysc_is_dup_inst_list(diff_match->schema)) {
                meta_name = "position";
            } else if (diff_match->schema->nodetype == LYS_LIST) {
                meta_name = "key";
            } else {
                meta_name = "value";
            }

            lyd_diff_del_meta(diff_match, meta_name);
            meta = lyd_find_meta(src_diff->meta, mod, meta_name);
            LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, meta_name, src_diff), LY_EINVAL);
            LY_CHECK_RET(lyd_dup_meta_single(meta, diff_match, NULL));
            break;
        case LYS_LEAF:
            /* replaced with the exact same value, impossible */
            if (!lyd_compare_single(diff_match, src_diff, 0)) {
                LOGERR_UNEXPVAL(ctx, diff_match, "target diff");
                return LY_EINVAL;
            }

            /* modify the node value */
            if (lyd_change_term(diff_match, lyd_get_value(src_diff))) {
                LOGINT_RET(LYD_CTX(src_diff));
            }

            if (cur_op == LYD_DIFF_OP_REPLACE) {
                /* compare values whether there is any change at all */
                meta = lyd_find_meta(diff_match->meta, mod, "orig-value");
                LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, "orig-value", diff_match), LY_EINVAL);
                str_val = lyd_get_meta_value(meta);
                ret = lyd_value_compare((struct lyd_node_term *)diff_match, str_val, strlen(str_val));
                if (!ret) {
                    /* values are the same, remove orig-value meta and set oper to NONE */
                    lyd_free_meta_single(meta);
                    LY_CHECK_RET(lyd_diff_change_op(diff_match, LYD_DIFF_OP_NONE));
                }
            }

            /* modify the default flag */
            diff_match->flags &= ~LYD_DEFAULT;
            diff_match->flags |= src_diff->flags & LYD_DEFAULT;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            if (!lyd_compare_single(diff_match, src_diff, 0)) {
                LOGERR_UNEXPVAL(ctx, diff_match, "target diff");
                return LY_EINVAL;
            }

            /* modify the node value */
            any = (struct lyd_node_any *)src_diff;
            LY_CHECK_RET(lyd_any_copy_value(diff_match, &any->value, any->value_type));
            break;
        default:
            LOGINT_RET(LYD_CTX(src_diff));
        }
        break;
    case LYD_DIFF_OP_NONE:
        switch (diff_match->schema->nodetype) {
        case LYS_LIST:
            /* it is moved now */
            assert(lysc_is_userordered(diff_match->schema));

            /* change the operation */
            LY_CHECK_RET(lyd_diff_change_op(diff_match, LYD_DIFF_OP_REPLACE));

            /* set orig-meta and meta */
            if (lysc_is_dup_inst_list(diff_match->schema)) {
                meta_name = "position";
                orig_meta_name = "orig-position";
            } else {
                meta_name = "key";
                orig_meta_name = "orig-key";
            }

            meta = lyd_find_meta(src_diff->meta, mod, orig_meta_name);
            LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, orig_meta_name, src_diff), LY_EINVAL);
            LY_CHECK_RET(lyd_dup_meta_single(meta, diff_match, NULL));

            meta = lyd_find_meta(src_diff->meta, mod, meta_name);
            LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, meta_name, src_diff), LY_EINVAL);
            LY_CHECK_RET(lyd_dup_meta_single(meta, diff_match, NULL));
            break;
        case LYS_LEAF:
            /* only dflt flag changed, now value changed as well, update the operation */
            LY_CHECK_RET(lyd_diff_change_op(diff_match, LYD_DIFF_OP_REPLACE));

            /* modify the node value */
            if (lyd_change_term(diff_match, lyd_get_value(src_diff))) {
                LOGINT_RET(LYD_CTX(src_diff));
            }
            break;
        default:
            LOGINT_RET(LYD_CTX(src_diff));
        }
        break;
    default:
        /* delete operation is not valid */
        LOGERR_MERGEOP(ctx, diff_match, cur_op, LYD_DIFF_OP_REPLACE);
        return LY_EINVAL;
    }

    return LY_SUCCESS;
}